

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::hugeint_t,short,duckdb::GenericUnaryWrapper,duckdb::DecimalScaleUpCheckOperator>
               (hugeint_t *ldata,short *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  short sVar3;
  ulong idx;
  ulong uVar4;
  int64_t *piVar5;
  ulong uVar6;
  idx_t idx_00;
  ulong idx_01;
  ulong uVar7;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar5 = &ldata->upper;
    for (idx_00 = 0; count != idx_00; idx_00 = idx_00 + 1) {
      input.upper = *piVar5;
      input.lower = ((hugeint_t *)(piVar5 + -1))->lower;
      sVar3 = DecimalScaleUpCheckOperator::Operation<duckdb::hugeint_t,short>
                        (input,result_mask,idx_00,dataptr);
      result_data[idx_00] = sVar3;
      piVar5 = piVar5 + 2;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    idx_01 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar7 = count;
        }
LAB_006ecbe1:
        piVar5 = &ldata[idx_01].upper;
        for (; idx = idx_01, idx_01 < uVar7; idx_01 = idx_01 + 1) {
          input_00.upper = *piVar5;
          input_00.lower = ((hugeint_t *)(piVar5 + -1))->lower;
          sVar3 = DecimalScaleUpCheckOperator::Operation<duckdb::hugeint_t,short>
                            (input_00,result_mask,idx_01,dataptr);
          result_data[idx_01] = sVar3;
          piVar5 = piVar5 + 2;
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        uVar7 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar7 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_006ecbe1;
        idx = uVar7;
        if (uVar2 != 0) {
          piVar5 = &ldata[idx_01].upper;
          for (uVar6 = 0; idx = uVar6 + idx_01, idx < uVar7; uVar6 = uVar6 + 1) {
            if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
              input_01.upper = *piVar5;
              input_01.lower = ((hugeint_t *)(piVar5 + -1))->lower;
              sVar3 = DecimalScaleUpCheckOperator::Operation<duckdb::hugeint_t,short>
                                (input_01,result_mask,idx,dataptr);
              result_data[idx_01 + uVar6] = sVar3;
            }
            piVar5 = piVar5 + 2;
          }
        }
      }
      idx_01 = idx;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}